

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

double * __thiscall Graph::getLosses(Graph *this)

{
  double *pdVar1;
  double dVar2;
  Edge *local_28;
  Edge *e;
  Vertex *v;
  double *loss;
  Graph *this_local;
  
  pdVar1 = (double *)operator_new__(0x10);
  *pdVar1 = 0.0;
  pdVar1[1] = 0.0;
  for (e = (Edge *)this->verticesList; e != (Edge *)0x0; e = (Edge *)Vertex::getNext((Vertex *)e)) {
    for (local_28 = Vertex::getEdgesList((Vertex *)e); local_28 != (Edge *)0x0;
        local_28 = Edge::getNext(local_28)) {
      dVar2 = Edge::getActiveLoss(local_28);
      *pdVar1 = dVar2 + *pdVar1;
      dVar2 = Edge::getReactiveLoss(local_28);
      pdVar1[1] = dVar2 + pdVar1[1];
    }
  }
  return pdVar1;
}

Assistant:

double * Graph::getLosses(){
    double *loss = new double[2];
    loss[0] = 0.0;
    loss[1] = 0.0;
    for(Vertex *v=verticesList; v!=NULL; v = v->getNext()){
        for(Edge *e = v->getEdgesList(); e!=NULL; e = e->getNext()){
            loss[0] += e->getActiveLoss();
            loss[1] += e->getReactiveLoss();
        }
    }
    return loss;
}